

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_flac__read_int32(ma_dr_flac_bs *bs,uint bitCount,ma_int32 *pResult)

{
  ulong uVar1;
  ma_bool32 mVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar3 = bs->consumedBits;
  if (uVar3 == 0x40) {
    mVar2 = ma_dr_flac__reload_cache(bs);
    if (mVar2 == 0) {
      return 0;
    }
    uVar3 = bs->consumedBits;
  }
  uVar7 = 0x40 - (ulong)uVar3;
  bVar4 = (byte)bitCount;
  if (uVar7 < bitCount) {
    uVar1 = bs->cache;
    mVar2 = ma_dr_flac__reload_cache(bs);
    if (mVar2 == 0) {
      return 0;
    }
    uVar6 = bitCount - (int)uVar7;
    if (0x40 - (ulong)bs->consumedBits < (ulong)uVar6) {
      return 0;
    }
    bVar5 = (byte)uVar6;
    uVar8 = (uint)((~(0xffffffffffffffffU >> (bVar5 & 0x3f)) & bs->cache) >> (-bVar5 & 0x3f)) |
            (int)((~(0xffffffffffffffffU >> ((byte)uVar7 & 0x3f)) & uVar1) >> ((byte)uVar3 & 0x3f))
            << (bVar5 & 0x1f);
    bs->consumedBits = bs->consumedBits + uVar6;
    bs->cache = bs->cache << (bVar5 & 0x3f);
  }
  else {
    uVar8 = (uint)((~(0xffffffffffffffffU >> (bVar4 & 0x3f)) & bs->cache) >> (-bVar4 & 0x3f));
    bs->consumedBits = uVar3 + bitCount;
    bs->cache = bs->cache << (bVar4 & 0x3f);
  }
  if (bitCount < 0x20) {
    uVar8 = -(uint)((uVar8 >> (bitCount - 1 & 0x1f) & 1) != 0) << (bVar4 & 0x1f) | uVar8;
  }
  *pResult = uVar8;
  return 1;
}

Assistant:

static ma_bool32 ma_dr_flac__read_int32(ma_dr_flac_bs* bs, unsigned int bitCount, ma_int32* pResult)
{
    ma_uint32 result;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(pResult != NULL);
    MA_DR_FLAC_ASSERT(bitCount > 0);
    MA_DR_FLAC_ASSERT(bitCount <= 32);
    if (!ma_dr_flac__read_uint32(bs, bitCount, &result)) {
        return MA_FALSE;
    }
    if (bitCount < 32) {
        ma_uint32 signbit;
        signbit = ((result >> (bitCount-1)) & 0x01);
        result |= (~signbit + 1) << bitCount;
    }
    *pResult = (ma_int32)result;
    return MA_TRUE;
}